

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

void Abc_GraphBuildFrontier
               (int nSize,Vec_Int_t *vEdges,Vec_Int_t *vLife,Vec_Wec_t *vFronts,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void *__ptr;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *p_00;
  Hsh_VecMan_t *p_01;
  Hsh_VecMan_t *__ptr_00;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  Hsh_VecMan_t *__ptr_01;
  size_t __nmemb;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long local_80;
  timespec ts;
  
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    local_80 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_80 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar4 = vEdges->nSize;
  uVar15 = iVar4 / 2;
  iVar16 = vLife->nSize / 2;
  p = (Vec_Wec_t *)malloc(0x10);
  uVar1 = uVar15 - 1;
  uVar10 = 8;
  if (6 < uVar1) {
    uVar10 = uVar15;
  }
  p->nSize = 0;
  p->nCap = uVar10;
  if (uVar10 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)(int)uVar10,0x10);
  }
  p->pArray = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar11 = iVar16;
  if (iVar16 - 1U < 0xf) {
    iVar11 = 0x10;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar11;
  if (iVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar7->pArray = piVar8;
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0xe < uVar1) {
    uVar10 = uVar15;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar10;
  if (uVar10 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar10 << 2);
  }
  p_00->pArray = piVar8;
  __nmemb = (size_t)iVar16;
  piVar8 = (int *)calloc(__nmemb,4);
  iVar16 = (int)__nmemb;
  p_01 = Hsh_VecManStart(iVar16);
  __ptr_00 = Hsh_VecManStart(iVar16);
  Hsh_VecManAdd(p_01,pVVar7);
  if (1 < iVar4) {
    uVar17 = 0;
    __ptr_01 = p_01;
    do {
      p_01 = __ptr_00;
      pVVar9 = Vec_WecPushLevel(p);
      uVar10 = __ptr_01->vMap->nSize;
      Vec_IntPush(p_00,uVar10);
      if (fVerbose != 0) {
        putchar(10);
        if (((long)vEdges->nSize <= (long)(uVar17 * 2)) ||
           (uVar12 = uVar17 * 2 | 1, (long)vEdges->nSize <= (long)uVar12)) {
LAB_00493a2d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("Processing edge %d = {%d %d}\n",uVar17 & 0xffffffff,
               (ulong)(uint)vEdges->pArray[uVar17 * 2],(ulong)(uint)vEdges->pArray[uVar12]);
        printf("Frontier: ");
        if ((long)vFronts->nSize <= (long)uVar17) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar2 = vFronts->pArray;
        printf("Vector has %d entries: {",(ulong)(uint)pVVar2[uVar17].nSize);
        if (0 < pVVar2[uVar17].nSize) {
          lVar14 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar2[uVar17].pArray[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar2[uVar17].nSize);
        }
        puts(" }");
        putchar(10);
      }
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          if ((long)__ptr_01->vMap->nSize <= (long)uVar12) goto LAB_00493a2d;
          iVar4 = __ptr_01->vMap->pArray[uVar12];
          if (((long)iVar4 < 0) || (__ptr_01->vData->nSize <= iVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = __ptr_01->vData->pArray + iVar4;
          iVar4 = *piVar3;
          (__ptr_01->vTemp).nCap = iVar4;
          (__ptr_01->vTemp).nSize = iVar4;
          (__ptr_01->vTemp).pArray = piVar3 + 2;
          iVar4 = 0;
          do {
            uVar5 = Abc_GraphBuildState(&__ptr_01->vTemp,(int)uVar17,iVar4,vEdges,vLife,vFronts,
                                        piVar8,pVVar7,fVerbose);
            uVar6 = uVar5;
            if (uVar5 == 1) {
              uVar6 = 0xfffffffe;
            }
            uVar18 = (ulong)uVar6;
            if ((uVar5 == 1) && (uVar17 != uVar1)) {
              uVar6 = Hsh_VecManAdd(p_01,pVVar7);
              uVar18 = (ulong)uVar6;
            }
            if (fVerbose != 0) {
              printf("Return value = %d\n",uVar18);
            }
            Vec_IntPush(pVVar9,(int)uVar18);
            iVar4 = iVar4 + 1;
          } while (iVar4 == 1);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar10);
      }
      pVVar9 = __ptr_01->vTable;
      if (pVVar9->pArray != (int *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (int *)0x0;
      }
      if (pVVar9 != (Vec_Int_t *)0x0) {
        free(pVVar9);
      }
      pVVar9 = __ptr_01->vData;
      if (pVVar9->pArray != (int *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (int *)0x0;
      }
      if (pVVar9 != (Vec_Int_t *)0x0) {
        free(pVVar9);
      }
      pVVar9 = __ptr_01->vMap;
      if (pVVar9->pArray != (int *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (int *)0x0;
      }
      if (pVVar9 != (Vec_Int_t *)0x0) {
        free(pVVar9);
      }
      free(__ptr_01);
      __ptr_00 = Hsh_VecManStart((int)__ptr_01);
      uVar17 = uVar17 + 1;
      __ptr_01 = p_01;
    } while (uVar17 != uVar15);
  }
  Abc_GraphCountPaths(p,vEdges);
  uVar1 = p_00->nSize;
  lVar14 = (long)(int)uVar1;
  if (lVar14 < 1) {
    uVar17 = 0;
  }
  else {
    lVar13 = 0;
    uVar17 = 0;
    do {
      uVar17 = (ulong)(uint)((int)uVar17 + p_00->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
  }
  printf("States = %8d   Paths = %24.0f  ",uVar17);
  iVar16 = 3;
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar13 + local_80) / 1000000.0);
  if (fVerbose != 0) {
    printf("Vector has %d entries: {",(ulong)uVar1);
    if (0 < (int)uVar1) {
      piVar3 = p_00->pArray;
      lVar13 = 0;
      do {
        printf(" %d",(ulong)(uint)piVar3[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar14 != lVar13);
    }
    puts(" }");
  }
  Abc_GraphDeriveGiaDump(p,vEdges,nSize);
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  if (0 < p->nCap) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      __ptr = *(void **)((long)&p->pArray->nCap + lVar14);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&p->pArray->nCap + lVar14) = 0;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < p->nCap);
  }
  if (p->pArray != (Vec_Int_t *)0x0) {
    free(p->pArray);
    p->pArray = (Vec_Int_t *)0x0;
  }
  p->nCap = 0;
  p->nSize = 0;
  free(p);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pVVar7 = p_01->vTable;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = p_01->vData;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = p_01->vMap;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  free(p_01);
  pVVar7 = __ptr_00->vTable;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = __ptr_00->vData;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = __ptr_00->vMap;
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  free(__ptr_00);
  return;
}

Assistant:

void Abc_GraphBuildFrontier( int nSize, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int fVerbose )
{
    abctime clk = Abc_Clock();
    double nPaths;
    int nEdges = Vec_IntSize(vEdges)/2;
    int nNodes = Vec_IntSize(vLife)/2;
    Vec_Wec_t * vNodes = Vec_WecAlloc( nEdges );
    Vec_Int_t * vStateNew = Vec_IntAlloc( nNodes );
    Vec_Int_t * vStateCount = Vec_IntAlloc( nEdges );
    int e, s, x, Next, * pFront = ABC_CALLOC( int, nNodes );
    Hsh_VecMan_t * pThis = Hsh_VecManStart( 1000 );
    Hsh_VecMan_t * pNext = Hsh_VecManStart( 1000 );
    Hsh_VecManAdd( pThis, vStateNew );
    for ( e = 0; e < nEdges; e++ )
    {
        Vec_Int_t * vNode = Vec_WecPushLevel(vNodes);
        int nStates = Hsh_VecSize( pThis );
        Vec_IntPush( vStateCount, nStates );
        if ( fVerbose )
        {
            printf( "\n" );
            printf( "Processing edge %d = {%d %d}\n", e, Vec_IntEntry(vEdges, 2*e), Vec_IntEntry(vEdges, 2*e+1) );
            printf( "Frontier: " );  Vec_IntPrint( Vec_WecEntry(vFronts, e) );
            printf( "\n" );
        }
        for ( s = 0; s < nStates; s++ )
        {
            Vec_Int_t * vState = Hsh_VecReadEntry(pThis, s);
            for ( x = 0; x < 2; x++ )
            {
                Next = Abc_GraphBuildState(vState, e, x, vEdges, vLife, vFronts, pFront, vStateNew, fVerbose);
                if ( Next == 1 )
                {
                    if ( e == nEdges - 1 ) // last edge
                        Next = -2; // const1
                    else
                        Next = Hsh_VecManAdd( pNext, vStateNew );
                }
                if ( fVerbose ) printf( "Return value = %d\n", Next );
                Vec_IntPush( vNode, Next );
            }
        }
        Hsh_VecManStop( pThis );
        pThis = pNext;
        pNext = Hsh_VecManStart( 1000 );
    }
    nPaths = Abc_GraphCountPaths(vNodes, vEdges);
    printf( "States = %8d   Paths = %24.0f  ", Vec_IntSum(vStateCount), nPaths ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
        Vec_IntPrint( vStateCount );
    Abc_GraphDeriveGiaDump( vNodes, vEdges, nSize );
    ABC_FREE( pFront );
    Vec_WecFree( vNodes );
    Vec_IntFree( vStateNew );
    Vec_IntFree( vStateCount );
    Hsh_VecManStop( pThis );
    Hsh_VecManStop( pNext );
}